

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O2

void mpc_sbox_verify_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong local_98 [3];
  uint64_t r2m [2];
  uint64_t x2m [2];
  uint64_t x1s [2];
  uint64_t x0s [2];
  uint64_t r1m [2];
  uint64_t r0m [2];
  uint64_t r1s [2];
  uint64_t r0s [2];
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    uVar1 = *(ulong *)((long)in + lVar2);
    uVar3 = *(ulong *)((long)rvec + lVar2);
    *(ulong *)((long)x1s + lVar2 + 8) = uVar3 & 0x4924924800000000;
    *(ulong *)((long)r1m + lVar2 + 8) = (uVar3 & 0x4924924800000000) * 2;
    *(ulong *)((long)x2m + lVar2 + 8) = uVar1 * 4 & 0x9249249000000000;
    *(ulong *)((long)r2m + lVar2 + -8) = uVar1 & 0x9249249000000000;
    *(ulong *)((long)x0s + lVar2 + 8) = uVar3 & 0x2492492400000000;
    *(ulong *)((long)r2m + lVar2 + 8) = uVar1 * 2 & 0x9249249000000000;
    *(ulong *)((long)local_98 + lVar2) = uVar3 & 0x9249249000000000;
    *(ulong *)((long)r0m + lVar2 + 8) = (uVar3 & 0x2492492400000000) << 2;
  }
  x0s[1] = (x2m[0] ^ r2m[1]) & x2m[1] ^ x1s[0] & r2m[1] ^ local_98[0] ^ local_98[1];
  x1s[1] = (r2m[0] ^ local_98[2]) & x2m[1] ^ local_98[2] & x1s[0] ^ r0m[1] ^ r1s[0];
  local_98[0] = x2m[0] & local_98[2] ^ r1m[1] ^ r2m[1] & (r2m[0] ^ local_98[2]) ^ r0m[0];
  uVar1 = view->t[1];
  r1m[0] = uVar1 & 0x9249249000000000;
  local_98[1] = uVar1 * 2 & 0x9249249000000000;
  view->t[0] = x1s[1] >> 2 ^ x0s[1] ^ local_98[0] >> 1;
  x0s[0] = (uVar1 & 0x2492492400000000) << 2;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    uVar1 = *(ulong *)((long)x2m + lVar2 + 8);
    uVar3 = uVar1 ^ *(ulong *)((long)r2m + lVar2 + 8);
    *(ulong *)((long)in + lVar2) =
         (*(ulong *)((long)x1s + lVar2 + 8) ^ uVar3) >> 1 ^
         *(ulong *)((long)in + lVar2) & 0x3ffffffff ^ uVar3 ^
         (*(ulong *)((long)local_98 + lVar2) ^ uVar1) >> 2 ^ *(ulong *)((long)x0s + lVar2 + 8) ^
         *(ulong *)((long)r2m + lVar2 + -8);
  }
  return;
}

Assistant:

static void mpc_sbox_verify_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_VERIFY);

  mpc_and_verify_uint64(r0m, x0s, x1s, r2m, view, MASK_X2I, 0);
  mpc_and_verify_uint64(r2m, x1s, x2m, r1s, view, MASK_X2I, 1);
  mpc_and_verify_uint64(r1m, x0s, x2m, r0s, view, MASK_X2I, 2);

  bitsliced_step_2_uint64_10(SC_VERIFY);
}